

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O0

GLubyte * glewGetString(GLenum name)

{
  ulong local_20;
  size_t max_string;
  GLenum name_local;
  
  if (name < 5) {
    local_20 = (ulong)name;
  }
  else {
    local_20 = 0;
  }
  return glewGetString::_glewString[local_20];
}

Assistant:

const GLubyte * GLEWAPIENTRY glewGetString (GLenum name)
{
  static const GLubyte* _glewString[] =
  {
    (const GLubyte*)NULL,
    (const GLubyte*)"1.12.0",
    (const GLubyte*)"1",
    (const GLubyte*)"12",
    (const GLubyte*)"0"
  };
  const size_t max_string = sizeof(_glewString)/sizeof(*_glewString) - 1;
  return _glewString[(size_t)name > max_string ? 0 : (size_t)name];
}